

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

Float pbrt::InfiniteLightDensity
                (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                LightSamplerHandle *lightSampler,Vector3f *w)

{
  undefined8 uVar1;
  Vector3f wi;
  LightSampleContext ctx;
  bool bVar2;
  reference pLVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float fVar7;
  Vector3<float> VVar8;
  LightHandle *light;
  const_iterator __end1;
  const_iterator __begin1;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range1;
  Float pdf;
  Interaction *in_stack_fffffffffffffea8;
  Interaction *in_stack_fffffffffffffeb0;
  LightHandle *light_00;
  LightSamplerHandle *this;
  LightSamplingMode mode;
  undefined4 in_stack_fffffffffffffef0;
  Float in_stack_fffffffffffffef4;
  float in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff34;
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  Interaction *local_70;
  Interaction *pIStack_68;
  LightHandle *pLStack_60;
  LightSamplerHandle *pLStack_58;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_30 [2];
  Float local_1c;
  undefined1 extraout_var [60];
  undefined1 auVar6 [56];
  
  local_1c = 0.0;
  local_30[0]._M_current =
       (LightHandle *)
       std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                 ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                  in_stack_fffffffffffffea8);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             in_stack_fffffffffffffea8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar2) break;
    pLVar3 = __gnu_cxx::
             __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
             ::operator*(local_30);
    mode = (LightSamplingMode)((ulong)pLVar3 >> 0x20);
    vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    auVar4 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    auVar10 = auVar4._0_16_;
    uVar11 = auVar4._16_8_;
    auVar6 = ZEXT1656(SUB2416(ZEXT1624((undefined1  [16])0x0),8));
    Interaction::Interaction(in_stack_fffffffffffffeb0);
    LightSampleContext::LightSampleContext
              ((LightSampleContext *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    VVar8 = Tuple3<pbrt::Vector3,_float>::operator-
                      ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffeb0);
    fVar7 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar6;
    uVar1 = vmovlpd_avx(auVar4._0_16_);
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
    .high = (float)in_stack_ffffffffffffff24;
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
    .low = fVar7;
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
    .low = (float)(int)uVar1;
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
    .high = (float)(int)((ulong)uVar1 >> 0x20);
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z
    .low = fVar7;
    ctx.pi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z
    .high = (float)in_stack_ffffffffffffff34;
    auVar9 = auVar10._0_12_;
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar9._0_4_;
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar9._4_4_;
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar9._8_4_;
    ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar10._12_4_;
    ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)uVar11;
    ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)((ulong)uVar11 >> 0x20);
    wi.super_Tuple3<pbrt::Vector3,_float>.y = fVar7;
    wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar1 >> 0x20);
    wi.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffff14;
    in_stack_fffffffffffffea8 = local_70;
    in_stack_fffffffffffffeb0 = pIStack_68;
    light_00 = pLStack_60;
    this = pLStack_58;
    in_stack_fffffffffffffef4 =
         LightHandle::PDF_Li((LightHandle *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),ctx,wi,
                             mode);
    LightHandle::LightHandle
              ((LightHandle *)in_stack_fffffffffffffeb0,(LightHandle *)in_stack_fffffffffffffea8);
    auVar5._0_4_ = LightSamplerHandle::PDF(this,light_00);
    auVar5._4_60_ = extraout_var;
    auVar10 = vfmadd213ss_fma(auVar5._0_16_,ZEXT416((uint)in_stack_fffffffffffffef4),
                              ZEXT416((uint)local_1c));
    local_1c = auVar10._0_4_;
    __gnu_cxx::
    __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
    ::operator++(local_30);
  }
  return local_1c;
}

Assistant:

Float InfiniteLightDensity(const std::vector<LightHandle> &infiniteLights,
                           LightSamplerHandle lightSampler, const Vector3f &w) {
    Float pdf = 0;
    for (const auto &light : infiniteLights)
        pdf += light.PDF_Li(Interaction(), -w) * lightSampler.PDF(light);
    return pdf;
}